

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linuxaio_queue.cpp
# Opt level: O0

void __thiscall
foxxll::linuxaio_queue::handle_events
          (linuxaio_queue *this,io_event *events,long num_events,bool canceled)

{
  long *plVar1;
  long lVar2;
  request *r;
  int e;
  bool canceled_local;
  long num_events_local;
  io_event *events_local;
  linuxaio_queue *this_local;
  
  tlx::Semaphore::signal(&this->num_free_events_,(int)num_events,(__sighandler_t)num_events);
  for (r._0_4_ = 0; (int)r < num_events; r._0_4_ = (int)r + 1) {
    plVar1 = (long *)events[(int)r].data;
    lVar2 = *(long *)(*plVar1 + -0x68);
    (**(code **)(*(long *)((long)plVar1 + lVar2) + 0x18))
              ((long)plVar1 + lVar2,canceled,lVar2,
               CONCAT71((int7)((ulong)*plVar1 >> 8),canceled) & 0xffffffffffffff01);
    tlx::ReferenceCounter::dec_reference((ReferenceCounter *)(plVar1 + 1));
  }
  tlx::Semaphore::wait(&this->num_posted_requests_,(void *)num_events);
  return;
}

Assistant:

void linuxaio_queue::handle_events(io_event* events, long num_events, bool canceled)
{
    // first mark all events as free
    num_free_events_.signal(num_events);

    for (int e = 0; e < num_events; ++e)
    {
        request* r = reinterpret_cast<request*>(
                static_cast<uintptr_t>(events[e].data));
        r->completed(canceled);
        // release counting_ptr reference, this may delete the request object
        r->dec_reference();
    }

    num_posted_requests_.wait(num_events); // will never block
}